

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O0

size_t __thiscall ag::Generator::FunctionManager::If(FunctionManager *this)

{
  reference pvVar1;
  reference pvVar2;
  reference this_00;
  vector<ag::ByteCode,_std::allocator<ag::ByteCode>_> *this_01;
  vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
  *this_02;
  pair<unsigned_long,_int> pVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  unsigned_long local_48;
  int local_40;
  int local_34;
  size_t local_30;
  pair<unsigned_long,_int> local_28;
  size_type local_18;
  size_t cur_if;
  FunctionManager *this_local;
  
  this_01 = &this->m_code;
  cur_if = (size_t)this;
  pvVar1 = std::vector<ag::ByteCode,_std::allocator<ag::ByteCode>_>::operator[](this_01,this->m_cur)
  ;
  ByteCode::Add(pvVar1,If);
  this_02 = &this->m_linkAddr;
  pvVar2 = std::
           vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
           ::operator[](this_02,this->m_cur);
  local_18 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::size(pvVar2);
  pvVar2 = std::
           vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
           ::operator[](this_02,this->m_cur);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::resize(pvVar2,local_18 + 1);
  pvVar1 = std::vector<ag::ByteCode,_std::allocator<ag::ByteCode>_>::operator[](this_01,this->m_cur)
  ;
  local_30 = ByteCode::Count(pvVar1);
  local_34 = 0;
  pVar3 = std::make_pair<unsigned_long,int>(&local_30,&local_34);
  local_48 = pVar3.first;
  local_40 = pVar3.second;
  local_28.first = local_48;
  local_28.second = local_40;
  pvVar2 = std::
           vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
           ::operator[](this_02,this->m_cur);
  this_00 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::operator[](pvVar2,local_18);
  std::pair<unsigned_long,unsigned_long>::operator=
            ((pair<unsigned_long,unsigned_long> *)this_00,&local_28);
  pvVar1 = std::vector<ag::ByteCode,_std::allocator<ag::ByteCode>_>::operator[](this_01,this->m_cur)
  ;
  BitConverter::GetUInt32(&local_60,0);
  ByteCode::Add(pvVar1,&local_60);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
  return local_18;
}

Assistant:

inline size_t If()
			{
				m_code[m_cur].Add(OpCode::If);

				size_t cur_if = m_linkAddr[m_cur].size();
				m_linkAddr[m_cur].resize(cur_if + 1);
				m_linkAddr[m_cur][cur_if] = std::make_pair(m_code[m_cur].Count(), 0);

				m_code[m_cur].Add(BitConverter::GetUInt32(0u));

				return cur_if;
			}